

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msbuild_objectmodel.cpp
# Opt level: O3

xml_output * attrTagX(xml_output *__return_storage_ptr__,char *name,QStringList *v,char *s)

{
  char *pcVar1;
  long i;
  Data *pDVar2;
  Data *pDVar3;
  char16_t *pcVar4;
  qsizetype qVar5;
  storage_type *psVar6;
  char16_t *pcVar7;
  storage_type *psVar8;
  long in_FS_OFFSET;
  QByteArrayView QVar9;
  QByteArrayView QVar10;
  QByteArrayView QVar11;
  QString local_98;
  QArrayDataPointer<QString> local_78;
  char *local_60;
  QString local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  i = (v->d).size;
  local_60 = name;
  if (i == 0) {
    __return_storage_ptr__->xo_type = tNothing;
    if (*(long *)(in_FS_OFFSET + 0x28) != local_38) goto LAB_001f6748;
    (__return_storage_ptr__->xo_value).d.ptr = (char16_t *)0x0;
    (__return_storage_ptr__->xo_value).d.size = 0;
    (__return_storage_ptr__->xo_text).d.size = 0;
    (__return_storage_ptr__->xo_value).d.d = (Data *)0x0;
    (__return_storage_ptr__->xo_text).d.d = (Data *)0x0;
    (__return_storage_ptr__->xo_text).d.ptr = (char16_t *)0x0;
  }
  else {
    local_78.d = (v->d).d;
    local_78.ptr = (v->d).ptr;
    if (local_78.d != (Data *)0x0) {
      LOCK();
      ((local_78.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_78.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    QVar9.m_data = (storage_type *)0x5;
    QVar9.m_size = (qsizetype)&local_58;
    local_78.size = i;
    QString::fromUtf8(QVar9);
    local_98.d.d = local_58.d.d;
    local_98.d.ptr = local_58.d.ptr;
    local_98.d.size = local_58.d.size;
    QString::arg<const_char_*,_true>(&local_58,&local_98,&local_60,0,(QChar)0x20);
    QtPrivate::QMovableArrayOps<QString>::emplace<QString>
              ((QMovableArrayOps<QString> *)&local_78,i,&local_58);
    QList<QString>::end((QList<QString> *)&local_78);
    if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (&(local_98.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_98.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (local_60 == (char *)0x0) {
      psVar8 = (storage_type *)0x0;
    }
    else {
      psVar6 = (storage_type *)0xffffffffffffffff;
      do {
        psVar8 = psVar6 + 1;
        pcVar1 = local_60 + 1 + (long)psVar6;
        psVar6 = psVar8;
      } while (*pcVar1 != '\0');
    }
    QVar10.m_data = psVar8;
    QVar10.m_size = (qsizetype)&local_58;
    QString::fromUtf8(QVar10);
    qVar5 = local_58.d.size;
    pcVar4 = local_58.d.ptr;
    pDVar2 = local_58.d.d;
    if (s == (char *)0x0) {
      psVar8 = (storage_type *)0x0;
    }
    else {
      psVar6 = (storage_type *)0xffffffffffffffff;
      do {
        psVar8 = psVar6 + 1;
        pcVar1 = s + 1 + (long)psVar6;
        psVar6 = psVar8;
      } while (*pcVar1 != '\0');
    }
    QVar11.m_data = psVar8;
    QVar11.m_size = (qsizetype)&local_58;
    QString::fromUtf8(QVar11);
    pDVar3 = local_58.d.d;
    pcVar7 = local_58.d.ptr;
    if (local_58.d.ptr == (char16_t *)0x0) {
      pcVar7 = (char16_t *)&QString::_empty;
    }
    QtPrivate::QStringList_join((QList *)&local_58,(QChar *)&local_78,(longlong)pcVar7);
    __return_storage_ptr__->xo_type = tTagValue;
    (__return_storage_ptr__->xo_text).d.d = pDVar2;
    (__return_storage_ptr__->xo_text).d.ptr = pcVar4;
    (__return_storage_ptr__->xo_text).d.size = qVar5;
    if (&pDVar2->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    (__return_storage_ptr__->xo_value).d.d = local_58.d.d;
    (__return_storage_ptr__->xo_value).d.ptr = local_58.d.ptr;
    (__return_storage_ptr__->xo_value).d.size = local_58.d.size;
    if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
      if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,2,0x10);
        }
      }
    }
    if (&pDVar3->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&pDVar3->super_QArrayData,2,0x10);
      }
    }
    if (&pDVar2->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&pDVar2->super_QArrayData,2,0x10);
      }
    }
    QArrayDataPointer<QString>::~QArrayDataPointer(&local_78);
    if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
LAB_001f6748:
      __stack_chk_fail();
    }
  }
  return __return_storage_ptr__;
}

Assistant:

inline XmlOutput::xml_output attrTagX(const char *name, const QStringList &v, const char *s = ",")
{
    if(v.isEmpty())
        return noxml();
    QStringList temp = v;
    temp.append(QString("%(%1)").arg(name));
    return tagValue(name, temp.join(s));
}